

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

void __thiscall sfc::Image::save_indexed(Image *this,string *path)

{
  pointer puVar1;
  uint uVar2;
  runtime_error *this_00;
  char *pcVar3;
  uchar g;
  uchar a;
  uchar b;
  uint *c;
  pointer puVar4;
  byte_vec_t buffer;
  State state;
  allocator<char> local_299;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_298;
  string *local_280;
  Image *local_278;
  string local_270;
  State local_250;
  
  local_280 = path;
  if ((this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    set_default_palette(this,0x100);
  }
  lodepng::State::State(&local_250);
  puVar1 = (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_278 = this;
  for (puVar4 = (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    uVar2 = *puVar4;
    if ((int)uVar2 < 0) {
      g = (uchar)(uVar2 >> 8);
      b = (uchar)(uVar2 >> 0x10);
      a = (uchar)(uVar2 >> 0x18);
    }
    else {
      a = '\0';
      b = '\0';
      g = '\0';
      uVar2 = 0;
    }
    lodepng_palette_add(&local_250.super_LodePNGState.info_png.color,(uchar)uVar2,g,b,a);
    lodepng_palette_add(&local_250.super_LodePNGState.info_raw,(uchar)uVar2,g,b,a);
  }
  local_250.super_LodePNGState.info_raw.colortype = LCT_PALETTE;
  local_250.super_LodePNGState.info_raw.bitdepth = 8;
  local_250.super_LodePNGState.info_png.color.colortype = LCT_PALETTE;
  local_250.super_LodePNGState.info_png.color.bitdepth = 8;
  local_250.super_LodePNGState.encoder.auto_convert = 0;
  local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = lodepng::encode(&local_298,&local_278->_indexed_data,local_278->_width,local_278->_height,
                          &local_250);
  if (uVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,(local_280->_M_dataplus)._M_p,&local_299);
    lodepng::save_file(&local_298,&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if (local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_298.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    lodepng::State::~State(&local_250);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar3 = lodepng_error_text(uVar2);
  std::runtime_error::runtime_error(this_00,pcVar3);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Image::save_indexed(const std::string& path) {
  if (_palette.empty())
    set_default_palette();

  lodepng::State state;
  for (const auto& c : _palette) {
    rgba_color rgba(c);
    lodepng_palette_add(&state.info_png.color, rgba.r, rgba.g, rgba.b, rgba.a);
    lodepng_palette_add(&state.info_raw, rgba.r, rgba.g, rgba.b, rgba.a);
  }
  state.info_png.color.colortype = state.info_raw.colortype = LCT_PALETTE;
  state.info_png.color.bitdepth = state.info_raw.bitdepth = 8;
  state.encoder.auto_convert = 0;

  byte_vec_t buffer;
  unsigned error = lodepng::encode(buffer, _indexed_data, _width, _height, state);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));
  lodepng::save_file(buffer, path.c_str());
}